

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_writeCTable(void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog
                      )

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *buffer;
  char *dst_00;
  uint maxSymbolValue_1;
  BYTE bitsToWeight [13];
  uint count [13];
  BYTE huffWeight [255];
  BYTE scratchBuffer [64];
  FSE_CTable CTable_1 [59];
  uint local_2ec;
  size_t local_2e8;
  size_t local_2e0;
  char local_2d5 [13];
  short local_2c8 [16];
  uint local_2a8 [16];
  char local_268 [256];
  undefined1 local_168 [64];
  FSE_CTable local_128 [62];
  
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  local_2d5[0] = '\0';
  uVar2 = huffLog + 1;
  if (1 < uVar2) {
    uVar5 = 1;
    do {
      local_2d5[uVar5] = (char)huffLog;
      uVar5 = uVar5 + 1;
      huffLog = (uint)(byte)((char)huffLog - 1);
    } while (uVar2 != uVar5);
  }
  uVar5 = (ulong)maxSymbolValue;
  if (maxSymbolValue != 0) {
    uVar4 = 0;
    do {
      local_268[uVar4] = local_2d5[CTable[uVar4].nbBits];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  buffer = (char *)((long)dst + 1);
  local_2ec = 0xc;
  if (maxSymbolValue < 2) {
    uVar4 = 0;
  }
  else {
    uVar3 = HIST_count_simple(local_2a8,&local_2ec,local_268,uVar5);
    uVar2 = local_2ec;
    uVar6 = (ulong)(uVar3 == maxSymbolValue);
    uVar4 = uVar6;
    if (uVar3 != maxSymbolValue && uVar3 != 1) {
      uVar3 = FSE_optimalTableLog_internal(6,uVar5,local_2ec,2);
      uVar4 = FSE_normalizeCount(local_2c8,uVar3,local_2a8,uVar5,uVar2);
      if (uVar4 < 0xffffffffffffff89) {
        local_2e0 = maxDstSize - 1;
        uVar4 = FSE_writeNCount(buffer,local_2e0,local_2c8,uVar2,uVar3);
        if ((uVar4 < 0xffffffffffffff89) &&
           (local_2e8 = uVar4,
           uVar4 = FSE_buildCTable_wksp(local_128,local_2c8,uVar2,uVar3,local_168,0x40),
           uVar4 < 0xffffffffffffff89)) {
          dst_00 = buffer + local_2e8;
          uVar4 = FSE_compress_usingCTable(dst_00,local_2e0 - local_2e8,local_268,uVar5,local_128);
          if (uVar4 < 0xffffffffffffff89) {
            if (uVar4 == 0) {
              bVar1 = false;
              uVar4 = 0;
            }
            else {
              dst_00 = dst_00 + uVar4;
              bVar1 = true;
              uVar4 = uVar6;
            }
          }
          else {
            bVar1 = false;
          }
          if (bVar1) {
            uVar4 = (long)dst_00 - (long)buffer;
          }
        }
      }
    }
  }
  if (uVar4 < 0xffffffffffffff89) {
    if (maxSymbolValue >> 1 <= uVar4 || uVar4 < 2) {
      bVar1 = true;
      goto LAB_001100f7;
    }
    *(char *)dst = (char)uVar4;
    uVar4 = uVar4 + 1;
  }
  bVar1 = false;
LAB_001100f7:
  if ((bVar1) && (uVar4 = 0xffffffffffffffff, maxSymbolValue < 0x81)) {
    uVar6 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
    uVar4 = 0xffffffffffffffba;
    if (uVar6 <= maxDstSize) {
      *(char *)dst = (char)maxSymbolValue + '\x7f';
      local_268[uVar5] = '\0';
      uVar4 = uVar6;
      if (maxSymbolValue != 0) {
        uVar6 = 0;
        do {
          *buffer = local_268[uVar6] * '\x10' + local_268[uVar6 + 1];
          uVar6 = uVar6 + 2;
          buffer = buffer + 1;
        } while (uVar6 < uVar5);
      }
    }
  }
  return uVar4;
}

Assistant:

size_t HUF_writeCTable (void* dst, size_t maxDstSize,
                        const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog)
{
    BYTE bitsToWeight[HUF_TABLELOG_MAX + 1];   /* precomputed conversion table */
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX];
    BYTE* op = (BYTE*)dst;
    U32 n;

     /* check conditions */
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        huffWeight[n] = bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, huffWeight, maxSymbolValue) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((huffWeight[n] << 4) + huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}